

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

void collect_jobs(pmtr_t *cfg,UT_string *sm)

{
  bool bVar1;
  uint uVar2;
  pid_t pVar3;
  __pid_t __pid;
  uint uVar4;
  job_t *pjVar5;
  ulong local_e0;
  ulong local_c8;
  ulong local_a8;
  ulong local_90;
  long local_80;
  ulong local_78;
  ulong local_60;
  time_t local_50;
  size_t _ut_i;
  pid_t pid;
  job_t *job;
  time_t now;
  int elapsed;
  int ex;
  int es;
  UT_string *sm_local;
  pmtr_t *cfg_local;
  
  _ex = sm;
  sm_local = (UT_string *)cfg;
  while (uVar2 = waitpid(-1,&elapsed,1), 0 < (int)uVar2) {
    if (uVar2 == (uint)sm_local[1].n) {
      if (((elapsed & 0x7fU) == 0) && ((int)(elapsed & 0xff00U) >> 8 == 0x21)) {
        syslog(6,"inotify-based dependency monitoring disabled");
        *(undefined4 *)&sm_local[1].n = 0;
      }
      else {
        pVar3 = dep_monitor(sm_local->d);
        *(pid_t *)&sm_local[1].n = pVar3;
      }
    }
    else if (uVar2 == *(uint *)&sm_local[0xb3].d) {
      __pid = getpid();
      kill(__pid,0xf);
    }
    else {
      pjVar5 = get_job_by_pid((UT_array *)sm_local[1].i,uVar2);
      if (pjVar5 == (job_t *)0x0) {
        syslog(3,"sigchld for unknown pid %d",(ulong)uVar2);
      }
      else {
        pjVar5->pid = 0;
        pjVar5->terminate = 0;
        local_50 = time((time_t *)0x0);
        uVar4 = (int)local_50 - (int)pjVar5->start_ts;
        if ((int)uVar4 < 10) {
          local_50 = local_50 + 10;
        }
        pjVar5->start_at = local_50;
        if (pjVar5->once != 0) {
          pjVar5->respawn = 0;
        }
        _ex->i = 0;
        *_ex->d = '\0';
        utstring_printf(_ex,"job %s [%d] exited after %d sec: ",pjVar5->name,(ulong)uVar2,
                        (ulong)uVar4);
        if ('\0' < (char)(((byte)elapsed & 0x7f) + 1) >> 1) {
          utstring_printf(_ex,"signal %d",(ulong)(elapsed & 0x7f));
        }
        if ((elapsed & 0x7fU) == 0) {
          uVar2 = (int)(elapsed & 0xff00U) >> 8;
          if (uVar2 == 0x21) {
            pjVar5->respawn = 0;
          }
          utstring_printf(_ex,"exit status %d",(ulong)uVar2);
        }
        syslog(6,"%s",_ex->d);
        if (pjVar5->delete_when_collected != 0) {
          if (*(long *)(sm_local[1].i + 0x20) != 0) {
            bVar1 = false;
            while (!bVar1) {
              if (pjVar5 < *(job_t **)(sm_local[1].i + 0x28)) {
                local_60 = 0xffffffffffffffff;
              }
              else {
                local_60 = (ulong)((long)pjVar5 - *(long *)(sm_local[1].i + 0x28)) /
                           *(ulong *)(sm_local[1].i + 8);
              }
              if (local_60 < *(uint *)sm_local[1].i) {
                if (pjVar5 < *(job_t **)(sm_local[1].i + 0x28)) {
                  local_78 = 0xffffffffffffffff;
                }
                else {
                  local_78 = (ulong)((long)pjVar5 - *(long *)(sm_local[1].i + 0x28)) /
                             *(ulong *)(sm_local[1].i + 8);
                }
                local_80 = *(long *)(sm_local[1].i + 0x28) + *(long *)(sm_local[1].i + 8) * local_78
                ;
              }
              else {
                local_80 = 0;
              }
              (**(code **)(sm_local[1].i + 0x20))(local_80);
              bVar1 = true;
            }
          }
          if (pjVar5 < *(job_t **)(sm_local[1].i + 0x28)) {
            local_90 = 0xffffffffffffffff;
          }
          else {
            local_90 = (ulong)((long)pjVar5 - *(long *)(sm_local[1].i + 0x28)) /
                       *(ulong *)(sm_local[1].i + 8);
          }
          if (local_90 + 1 < (ulong)*(uint *)sm_local[1].i) {
            if (pjVar5 < *(job_t **)(sm_local[1].i + 0x28)) {
              local_a8 = 0xffffffffffffffff;
            }
            else {
              local_a8 = (ulong)((long)pjVar5 - *(long *)(sm_local[1].i + 0x28)) /
                         *(ulong *)(sm_local[1].i + 8);
            }
            if (pjVar5 < *(job_t **)(sm_local[1].i + 0x28)) {
              local_c8 = 0xffffffffffffffff;
            }
            else {
              local_c8 = (ulong)((long)pjVar5 - *(long *)(sm_local[1].i + 0x28)) /
                         *(ulong *)(sm_local[1].i + 8);
            }
            if (pjVar5 < *(job_t **)(sm_local[1].i + 0x28)) {
              local_e0 = 0xffffffffffffffff;
            }
            else {
              local_e0 = (ulong)((long)pjVar5 - *(long *)(sm_local[1].i + 0x28)) /
                         *(ulong *)(sm_local[1].i + 8);
            }
            memmove((void *)(*(long *)(sm_local[1].i + 0x28) +
                            *(long *)(sm_local[1].i + 8) * local_a8),
                    (void *)(*(long *)(sm_local[1].i + 0x28) +
                            *(long *)(sm_local[1].i + 8) * (local_c8 + 1)),
                    ((ulong)*(uint *)sm_local[1].i - (local_e0 + 1)) * *(long *)(sm_local[1].i + 8))
            ;
          }
          *(int *)sm_local[1].i = *(int *)sm_local[1].i + -1;
        }
      }
    }
  }
  return;
}

Assistant:

void collect_jobs(pmtr_t *cfg, UT_string *sm) {
  int es, ex, elapsed;
  time_t now;
  job_t *job;
  pid_t pid;

  while ( (pid = waitpid(-1, &es, WNOHANG)) > 0) {

    /* respawn if it's our dependency monitor, unless its flagged */
    if (pid==cfg->dm_pid) { 
      if (WIFEXITED(es) && ((WEXITSTATUS(es)) == PMTR_NO_RESTART)) {
        syslog(LOG_INFO, "inotify-based dependency monitoring disabled");
        cfg->dm_pid = 0;
      } else {
        cfg->dm_pid = dep_monitor(cfg->file);
      }
      continue;
    }
    /* if it's our logger sub process ... */
    if (pid==cfg->logger_pid) { 
      kill(getpid(), 15); /* induce graceful shutdown in main loop */
      continue;
    }
    /* find the job.  we should always find it by pid. */
    job = get_job_by_pid(cfg->jobs, pid);
    if (!job) {
      syslog(LOG_ERR,"sigchld for unknown pid %d",(int)pid); 
      continue;
    }
    /* decide if and when it should be restarted */
    job->pid = 0;
    job->terminate = 0; /* any termination request has succeeded */
    now = time(NULL);
    elapsed = now - job->start_ts;
    job->start_at = (elapsed < SHORT_DELAY) ? (now+SHORT_DELAY) : now;
    if (job->once) job->respawn=0;

    /* write a log message about how the job exited */
    utstring_clear(sm);
    utstring_printf(sm,"job %s [%d] exited after %d sec: ", job->name, 
      (int)pid, elapsed);
    if (WIFSIGNALED(es)) utstring_printf(sm, "signal %d", (int)WTERMSIG(es));
    if (WIFEXITED(es)) {
      if ( (ex = WEXITSTATUS(es)) == PMTR_NO_RESTART) job->respawn=0;
      utstring_printf(sm,"exit status %d", ex);
    }
    syslog(LOG_INFO,"%s",utstring_body(sm));

    /* is this a former job that was deleted from the config file? */
    if (job->delete_when_collected) {
      utarray_erase(cfg->jobs, utarray_eltidx(cfg->jobs,job), 1);
      job=NULL;
    }
  }
}